

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void __thiscall
sensors_analytics::utils::ObjectNode::SetString(ObjectNode *this,string *property_name,char *value)

{
  size_t sVar1;
  ostream *poVar2;
  string local_48;
  
  if (value != (char *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar1 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,value,value + sVar1);
    SetString(this,property_name,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"String property \'",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(property_name->_M_dataplus)._M_p,
                      property_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' value is NULL",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void ObjectNode::SetString(const string &property_name, const char *value) {
  if (value == NULL) {
    std::cerr << "String property '" << property_name
              << "' value is NULL"<< std::endl;
    return;
  }
  SetString(property_name, string(value));
}